

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

string * __thiscall DataRefs::GetDebugAcFilter_abi_cxx11_(DataRefs *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  char key [10];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if (*(int *)((long)&in_RSI[0x31].field_2 + 0xc) == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    snprintf(&stack0xffffffffffffffe6,10,"%06X",(ulong)*(uint *)((long)&in_RSI[0x31].field_2 + 0xc),
             in_R8,in_R9,&stack0xffffffffffffffe6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe5);
  }
  return in_RDI;
}

Assistant:

std::string DataRefs::GetDebugAcFilter() const
{
    char key[10];
    if ( !uDebugAcFilter ) return std::string();
    
    // convert to hex representation
    snprintf(key,sizeof(key),"%06X",uDebugAcFilter);
    return key;
}